

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O1

FT_UInt ps_unicodes_char_index(PS_Unicodes table,FT_UInt32 unicode)

{
  PS_UniMap *pPVar1;
  bool bVar2;
  FT_UInt FVar3;
  PS_UniMap *pPVar4;
  PS_UniMap *pPVar5;
  PS_UniMap *pPVar6;
  PS_UniMap *pPVar7;
  uint uVar8;
  
  pPVar4 = table->maps;
  pPVar5 = pPVar4 + ((ulong)table->num_maps - 1);
  pPVar7 = (PS_UniMap *)0x0;
  do {
    pPVar6 = pPVar7;
    if (pPVar5 < pPVar4) break;
    pPVar1 = pPVar4 + ((long)pPVar5 - (long)pPVar4 >> 4);
    pPVar6 = pPVar1;
    if (pPVar1->unicode == unicode) {
      bVar2 = false;
    }
    else {
      uVar8 = pPVar1->unicode & 0x7fffffff;
      if (uVar8 != unicode) {
        pPVar6 = pPVar7;
      }
      if (pPVar4 == pPVar5) {
        bVar2 = false;
      }
      else {
        if (uVar8 < unicode) {
          pPVar4 = pPVar1 + 1;
        }
        else {
          pPVar5 = pPVar1 + -1;
        }
        bVar2 = true;
      }
    }
    pPVar7 = pPVar6;
  } while (bVar2);
  if (pPVar6 == (PS_UniMap *)0x0) {
    FVar3 = 0;
  }
  else {
    FVar3 = pPVar6->glyph_index;
  }
  return FVar3;
}

Assistant:

static FT_UInt
  ps_unicodes_char_index( PS_Unicodes  table,
                          FT_UInt32    unicode )
  {
    PS_UniMap  *min, *max, *mid, *result = NULL;


    /* Perform a binary search on the table. */

    min = table->maps;
    max = min + table->num_maps - 1;

    while ( min <= max )
    {
      FT_UInt32  base_glyph;


      mid = min + ( ( max - min ) >> 1 );

      if ( mid->unicode == unicode )
      {
        result = mid;
        break;
      }

      base_glyph = BASE_GLYPH( mid->unicode );

      if ( base_glyph == unicode )
        result = mid; /* remember match but continue search for base glyph */

      if ( min == max )
        break;

      if ( base_glyph < unicode )
        min = mid + 1;
      else
        max = mid - 1;
    }

    if ( result )
      return result->glyph_index;
    else
      return 0;
  }